

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall QXmlStreamReaderPrivate::scanNData(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  qsizetype qVar2;
  QXmlStreamReaderPrivate *in_RDI;
  bool in_stack_00000015;
  short in_stack_00000016;
  char *in_stack_00000018;
  QXmlStreamReaderPrivate *in_stack_00000020;
  uint c;
  QXmlStreamReaderPrivate *this_00;
  
  this_00 = in_RDI;
  qVar2 = fastScanSpace(this);
  c = (uint)((ulong)in_RDI >> 0x20);
  if (qVar2 != 0) {
    bVar1 = scanString(in_stack_00000020,in_stack_00000018,in_stack_00000016,in_stack_00000015);
    if (bVar1) {
      return true;
    }
    putChar(this_00,c);
  }
  return false;
}

Assistant:

bool QXmlStreamReaderPrivate::scanNData()
{
    if (fastScanSpace()) {
        if (scanString(spell[NDATA], NDATA))
            return true;
        putChar(' ');
    }
    return false;
}